

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall
bsplib::Rdma::get(Rdma *this,int src_pid,Memslot src_slot,size_t src_offset,void *dst,size_t size)

{
  pointer *pppvVar1;
  pointer ppvVar2;
  iterator __position;
  Action action;
  void *local_70;
  Action local_68;
  
  local_70 = dst;
  if (((this->m_used_slots).
       super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>._M_impl.
       super__Vector_impl_data._M_start[(long)this->m_nprocs * src_slot + (long)this->m_pid].status
      & 1) == 0) {
    ppvVar2 = (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    __position._M_current =
         (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*const&>
                ((vector<void*,std::allocator<void*>> *)&this->m_local_slots,__position,&local_70);
    }
    else {
      *__position._M_current = dst;
      pppvVar1 = &(this->m_local_slots).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppvVar1 = *pppvVar1 + 1;
    }
    local_68.dst_slot = (long)__position._M_current - (long)ppvVar2 >> 3;
    local_68.kind = GET;
    local_68.dst_pid = this->m_pid;
    local_68.tag = 0;
    local_68.target_pid = src_pid;
    local_68.src_pid = src_pid;
    local_68.src_slot = src_slot;
    local_68.offset = src_offset;
    local_68.size = size;
    ActionBuf::push_back(&this->m_send_actions,&local_68);
    return;
  }
  __assert_fail("!( slot( m_pid, src_slot ).status & Memblock::PUSHED)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/rdma.cc"
                ,0x7a,"void bsplib::Rdma::get(int, Memslot, size_t, void *, size_t)");
}

Assistant:

void Rdma::get( int src_pid, Memslot src_slot, size_t src_offset,
        void * dst, size_t size )
{
#ifdef PROFILE
    TicToc t( TicToc::GET );
#endif
    assert( !( slot( m_pid, src_slot ).status & Memblock::PUSHED) );

    Memslot dst_slot = m_local_slots.size();
    m_local_slots.push_back( dst );

    Action action = { Action::GET, src_pid, src_pid, m_pid, 
                      0, src_slot, dst_slot, src_offset, size  };
    m_send_actions.push_back( action );
}